

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp-quicksort.cpp
# Opt level: O1

void strsort(uchar **strings,Lcp *lcps,int lo,int hi)

{
  int iVar1;
  Lcp LVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  uchar *__tmp;
  byte bVar10;
  byte bVar11;
  
  if (hi <= lo) {
    return;
  }
  puVar3 = strings[lo];
  iVar9 = lo + 1;
  iVar8 = hi;
  iVar6 = lo;
  do {
    puVar4 = strings[iVar9];
    iVar1 = lcps[iVar9];
    bVar10 = puVar4[iVar1];
    bVar11 = puVar3[iVar1];
    if ((bVar10 == bVar11) && (bVar11 != 0)) {
      lVar7 = 1;
      do {
        lcps[iVar9] = (int)lVar7 + iVar1;
        bVar10 = puVar4[lVar7 + iVar1];
        bVar11 = puVar3[lVar7 + iVar1];
        if (bVar10 != bVar11) break;
        lVar7 = lVar7 + 1;
      } while (bVar11 != 0);
    }
    if (bVar10 < bVar11) {
      puVar5 = strings[iVar6];
      strings[iVar6] = puVar4;
      strings[iVar9] = puVar5;
      LVar2 = lcps[iVar6];
      lcps[iVar6] = lcps[iVar9];
      lcps[iVar9] = LVar2;
      iVar9 = iVar9 + 1;
      iVar6 = iVar6 + 1;
    }
    else if (bVar10 == bVar11) {
      iVar9 = iVar9 + 1;
    }
    else {
      strings[iVar9] = strings[iVar8];
      strings[iVar8] = puVar4;
      LVar2 = lcps[iVar9];
      lcps[iVar9] = lcps[iVar8];
      lcps[iVar8] = LVar2;
      iVar8 = iVar8 + -1;
    }
    if (iVar8 < iVar9) {
      lcpsort<true>(strings,lcps,lo,iVar6 + -1);
      lcpsort<false>(strings,lcps,iVar8 + 1,hi);
      return;
    }
  } while( true );
}

Assistant:

void strsort(unsigned char * strings[], Lcp lcps[], int lo, int hi )
{
  if ( hi <= lo ) return;
  int lt = lo, gt = hi;

  unsigned char  *  pivotStr = strings[lo];
  for( int i = lo + 1; i <= gt; )
    {
      int cmpr = lcpstrcmp( pivotStr, strings[i], lcps[i] );
      if      (cmpr < 0) exch( strings, lcps, lt++, i++);
      else if (cmpr > 0) exch( strings, lcps, i, gt--);
      else            i++;
    }

  lcpsort<true> ( strings, lcps, lo, lt-1 );
  lcpsort<false>( strings, lcps, gt+1, hi );  
}